

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetStringDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  char *in_RCX;
  string_view input;
  string local_128;
  AlphaNum local_108;
  AlphaNum local_d8;
  AlphaNum local_a8;
  AlphaNum local_78;
  AlphaNum local_48;
  
  if (*(long *)(*(long *)(descriptor + 0x50) + 8) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\"\"",(allocator<char> *)&local_108);
  }
  else {
    local_108.piece_ =
         absl::lts_20240722::NullSafeStringView
                   (
                   "global::System.Text.Encoding.UTF8.GetString(global::System.Convert.FromBase64String(\""
                   );
    input._M_str = in_RCX;
    input._M_len = **(size_t **)(descriptor + 0x50);
    StringToBase64_abi_cxx11_(&local_128,(csharp *)(*(size_t **)(descriptor + 0x50))[1],input);
    local_a8.piece_._M_len = local_128._M_string_length;
    local_a8.piece_._M_str = local_128._M_dataplus._M_p;
    local_d8.piece_ = absl::lts_20240722::NullSafeStringView("\"), 0, ");
    absl::lts_20240722::AlphaNum::AlphaNum
              (&local_78,*(unsigned_long *)(*(long *)(descriptor + 0x50) + 8));
    local_48.piece_ = absl::lts_20240722::NullSafeStringView(")");
    absl::lts_20240722::StrCat<>
              (__return_storage_ptr__,&local_108,&local_a8,&local_d8,&local_78,&local_48);
    std::__cxx11::string::~string((string *)&local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetStringDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "\"\"";
    return absl::StrCat(
        "global::System.Text.Encoding.UTF8.GetString(global::System."
        "Convert.FromBase64String(\"",
        StringToBase64(descriptor->default_value_string()), "\"), 0, ",
        descriptor->default_value_string().length(), ")");
}